

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get-model.cpp
# Opt level: O1

char * get_model_or_exit(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  runtime_error *this;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_40;
  
  if (argc < 2) {
    __rhs = "LLAMACPP_TEST_MODELFILE";
    pcVar2 = getenv("LLAMACPP_TEST_MODELFILE");
    if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
      get_model_or_exit();
      iVar1 = std::__cxx11::string::compare(__rhs);
      if (iVar1 == 0) {
        pcVar2 = (char *)0x0;
      }
      else {
        iVar1 = std::__cxx11::string::compare(__rhs);
        if (iVar1 == 0) {
          pcVar2 = (char *)0x2;
        }
        else {
          iVar1 = std::__cxx11::string::compare(__rhs);
          pcVar2 = (char *)0x1;
          if (iVar1 != 0) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&bStack_40,"Invalid tool_choice: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __rhs);
            std::runtime_error::runtime_error(this,(string *)&bStack_40);
            __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
      return pcVar2;
    }
  }
  else {
    pcVar2 = argv[1];
  }
  return pcVar2;
}

Assistant:

char * get_model_or_exit(int argc, char *argv[]) {
    char * model_path;
    if (argc > 1) {
        model_path = argv[1];

    } else {
        model_path = getenv("LLAMACPP_TEST_MODELFILE");
        if (!model_path || strlen(model_path) == 0) {
            fprintf(stderr, "\033[33mWARNING: No model file provided. Skipping this test. Set LLAMACPP_TEST_MODELFILE=<gguf_model_path> to silence this warning and run this test.\n\033[0m");
            exit(EXIT_SUCCESS);
        }
    }

    return model_path;
}